

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

void __thiscall CServerBrowser::LoadServerlist(CServerBrowser *this)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  IStorage *pIVar4;
  undefined4 extraout_var;
  long lVar5;
  void *pvVar6;
  CServerInfo *pInfo;
  IConsole *pIVar7;
  _json_value *this_01;
  _json_value *p_Var8;
  CServerBrowser *in_RDI;
  long in_FS_OFFSET;
  uint i;
  json_value *rEntry;
  json_value *pJsonData;
  char *pFileData;
  int FileSize;
  IOHANDLE File;
  json_settings JsonSettings;
  NETADDR Addr;
  char aError [256];
  json_value *value;
  IOHANDLE io;
  _json_value *in_stack_fffffffffffffe68;
  uint local_184;
  undefined4 in_stack_fffffffffffffe98;
  undefined1 local_120 [24];
  undefined1 local_108 [8];
  char *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  json_settings *in_stack_ffffffffffffff18;
  CServerBrowser *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar4 = Storage(in_RDI);
  value = (json_value *)0x0;
  io = (IOHANDLE)0x0;
  iVar2 = (*(pIVar4->super_IInterface)._vptr_IInterface[4])(pIVar4,s_pFilename,1,0xffffffff,0,0);
  this_00 = (CServerBrowser *)CONCAT44(extraout_var,iVar2);
  if (this_00 != (CServerBrowser *)0x0) {
    lVar5 = io_length(io);
    uVar3 = (undefined4)lVar5;
    pvVar6 = mem_alloc(0);
    io_read(io,value,0);
    io_close((IOHANDLE)0x1366dc);
    mem_zero(io,(uint)((ulong)value >> 0x20));
    pInfo = (CServerInfo *)
            json_parse_ex(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    mem_free((void *)0x136716);
    if (pInfo == (CServerInfo *)0x0) {
      pIVar7 = Console(in_RDI);
      (*(pIVar7->super_IInterface)._vptr_IInterface[0x19])(pIVar7,1,s_pFilename,local_108,0);
    }
    else {
      this_01 = _json_value::operator[](in_stack_fffffffffffffe68,(char *)io);
      for (local_184 = 0; local_184 < (this_01->u).string.length; local_184 = local_184 + 1) {
        p_Var8 = _json_value::operator[](this_01,local_184);
        if (p_Var8->type == json_string) {
          memset(local_120,0,0x18);
          p_Var8 = _json_value::operator[](this_01,local_184);
          _json_value::operator_cast_to_char_(p_Var8);
          iVar2 = net_addr_from_str((NETADDR *)in_stack_fffffffffffffe68,(char *)io);
          if (iVar2 == 0) {
            Set(this_00,(NETADDR *)CONCAT44(uVar3,in_stack_fffffffffffffe98),
                (int)((ulong)pvVar6 >> 0x20),(int)pvVar6,pInfo);
          }
        }
      }
      json_value_free(value);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CServerBrowser::LoadServerlist()
{
	// read file data into buffer
	IOHANDLE File = Storage()->OpenFile(s_pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
		return;
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);

	if(pJsonData == 0)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, s_pFilename, aError);
		return;
	}

	// extract server list
	const json_value &rEntry = (*pJsonData)["serverlist"];
	for(unsigned i = 0; i < rEntry.u.array.length; ++i)
	{
		if(rEntry[i].type == json_string)
		{
			NETADDR Addr = { 0 };
			if(!net_addr_from_str(&Addr, rEntry[i]))
				Set(Addr, SET_MASTER_ADD, -1, 0);
		}
	}

	// clean up
	json_value_free(pJsonData);
}